

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlNewInputBufferString(char *str,xmlParserInputFlags flags)

{
  size_t size;
  xmlBufPtr pxVar1;
  xmlParserInputBufferPtr ret;
  xmlParserInputFlags flags_local;
  char *str_local;
  
  str_local = (char *)(*xmlMalloc)(0x40);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memset(str_local,0,0x40);
    str_local[0x30] = -1;
    str_local[0x31] = -1;
    str_local[0x32] = -1;
    str_local[0x33] = -1;
    size = strlen(str);
    pxVar1 = xmlBufCreateMem((xmlChar *)str,size,(uint)((flags & XML_INPUT_BUF_STATIC) != 0));
    *(xmlBufPtr *)(str_local + 0x20) = pxVar1;
    if (*(long *)(str_local + 0x20) == 0) {
      (*xmlFree)(str_local);
      str_local = (char *)0x0;
    }
  }
  return (xmlParserInputBufferPtr)str_local;
}

Assistant:

xmlParserInputBufferPtr
xmlNewInputBufferString(const char *str, xmlParserInputFlags flags) {
    xmlParserInputBufferPtr ret;

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->compressed = -1;

    ret->buffer = xmlBufCreateMem((const xmlChar *) str, strlen(str),
                                  (flags & XML_INPUT_BUF_STATIC ? 1 : 0));
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }

    return(ret);
}